

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O3

void __thiscall
cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::Matcher
          (Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits> *this,string_ref query,
          MatcherOptions *opts)

{
  pointer pcVar1;
  char cVar2;
  __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_> _Var3;
  char32_t *pcVar4;
  __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_> last;
  pointer pcVar5;
  long lVar6;
  long lVar7;
  pointer pcVar8;
  
  (this->super_MatchInfo)._vptr_MatchInfo = (_func_int **)&PTR__Matcher_0014bac8;
  (this->item_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->item_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->item_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->item_basename_)._M_current = (char32_t *)0x0;
  (this->props_).
  super__Vector_base<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->props_).
  super__Vector_base<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->props_).
  super__Vector_base<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->qit_basename_)._M_current = (char32_t *)0x0;
  (this->qit_basename_words_).
  super__Vector_base<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->qit_basename_words_).
  super__Vector_base<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->qit_basename_words_).
  super__Vector_base<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  decode<cpsm::Utf8StringTraits>(&this->query_,query);
  _Var3 = path_basename<cpsm::PlatformPathTraits,__gnu_cxx::__normal_iterator<char32_t_const*,std::vector<char32_t,std::allocator<char32_t>>>>
                    ((__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                      )(this->query_).super__Vector_base<char32_t,_std::allocator<char32_t>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                      )(this->query_).super__Vector_base<char32_t,_std::allocator<char32_t>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  (this->query_basename_)._M_current = _Var3._M_current;
  pcVar8 = (this->query_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar1 = (this->query_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar6 = (long)pcVar1 - (long)pcVar8;
  if (0 < lVar6 >> 4) {
    lVar7 = (lVar6 >> 4) + 1;
    pcVar8 = pcVar8 + 2;
    do {
      pcVar5 = pcVar8;
      cVar2 = u_hasBinaryProperty_70(pcVar5[-2],0x1e);
      if (cVar2 != '\0') {
        pcVar5 = pcVar5 + -2;
        goto LAB_00133212;
      }
      cVar2 = u_hasBinaryProperty_70(pcVar5[-1],0x1e);
      if (cVar2 != '\0') {
        pcVar5 = pcVar5 + -1;
        goto LAB_00133212;
      }
      cVar2 = u_hasBinaryProperty_70(*pcVar5,0x1e);
      if (cVar2 != '\0') goto LAB_00133212;
      cVar2 = u_hasBinaryProperty_70(pcVar5[1],0x1e);
      if (cVar2 != '\0') {
        pcVar5 = pcVar5 + 1;
        goto LAB_00133212;
      }
      lVar7 = lVar7 + -1;
      lVar6 = lVar6 + -0x10;
      pcVar8 = pcVar5 + 4;
    } while (1 < lVar7);
    pcVar8 = pcVar5 + 2;
  }
  lVar6 = lVar6 >> 2;
  if (lVar6 == 1) {
LAB_001331e5:
    cVar2 = u_hasBinaryProperty_70(*pcVar8,0x1e);
    pcVar5 = pcVar8;
    if (cVar2 == '\0') {
      pcVar5 = pcVar1;
    }
  }
  else if (lVar6 == 2) {
LAB_001331d0:
    cVar2 = u_hasBinaryProperty_70(*pcVar8,0x1e);
    pcVar5 = pcVar8;
    if (cVar2 == '\0') {
      pcVar8 = pcVar8 + 1;
      goto LAB_001331e5;
    }
  }
  else {
    pcVar5 = pcVar1;
    if ((lVar6 == 3) &&
       (cVar2 = u_hasBinaryProperty_70(*pcVar8,0x1e), pcVar5 = pcVar8, cVar2 == '\0')) {
      pcVar8 = pcVar8 + 1;
      goto LAB_001331d0;
    }
  }
LAB_00133212:
  this->case_sensitive_ = pcVar5 != pcVar1;
  decode<cpsm::Utf8StringTraits>(&this->crfile_,opts->crfile);
  _Var3 = path_basename<cpsm::PlatformPathTraits,__gnu_cxx::__normal_iterator<char32_t_const*,std::vector<char32_t,std::allocator<char32_t>>>>
                    ((__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                      )(this->crfile_).super__Vector_base<char32_t,_std::allocator<char32_t>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                      )(this->crfile_).super__Vector_base<char32_t,_std::allocator<char32_t>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  (this->crfile_basename_)._M_current = _Var3._M_current;
  pcVar4 = (this->crfile_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar7 = (long)pcVar4 - (long)_Var3._M_current;
  lVar6 = lVar7 >> 4;
  if (0 < lVar6) {
    last._M_current = pcVar4 + -2;
    lVar7 = lVar6 + 1;
    do {
      if ((char)last._M_current[1] == '.') {
        last._M_current = last._M_current + 2;
        goto LAB_001332f8;
      }
      if ((char)*last._M_current == '.') {
        last._M_current = last._M_current + 1;
        goto LAB_001332f8;
      }
      if ((char)last._M_current[-1] == '.') goto LAB_001332f8;
      if ((char)last._M_current[-2] == '.') {
        last._M_current = last._M_current + -1;
        goto LAB_001332f8;
      }
      last._M_current = last._M_current + -4;
      lVar7 = lVar7 + -1;
    } while (1 < lVar7);
    lVar7 = (long)(pcVar4 + lVar6 * -4) - (long)_Var3._M_current;
    pcVar4 = pcVar4 + lVar6 * -4;
  }
  lVar7 = lVar7 >> 2;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      last = _Var3;
      if ((lVar7 != 3) || (last._M_current = pcVar4, (char)pcVar4[-1] == '.')) goto LAB_001332f8;
      pcVar4 = pcVar4 + -1;
    }
    last._M_current = pcVar4;
    if ((char)pcVar4[-1] == '.') goto LAB_001332f8;
    pcVar4 = pcVar4 + -1;
  }
  last = _Var3;
  if ((char)pcVar4[-1] == '.') {
    last._M_current = pcVar4;
  }
LAB_001332f8:
  (this->crfile_ext_)._M_current = last._M_current;
  find_word_endings(&this->crfile_basename_word_ends_,(Iterator)_Var3._M_current,
                    (Iterator)last._M_current);
  this->match_crfile_ = opts->match_crfile;
  return;
}

Assistant:

explicit Matcher(boost::string_ref const query, MatcherOptions const& opts)
      // Queries are smartcased (case-sensitive only if any uppercase appears
      // in the query).
      : query_(decode<StringTraits>(query)),
        query_basename_(path_basename<PathTraits>(query_.cbegin(),
                                                  query_.cend())),
        case_sensitive_(std::any_of(query_.cbegin(), query_.cend(),
                                    StringTraits::is_uppercase)),
        crfile_(decode<StringTraits>(opts.crfile)),
        crfile_basename_(path_basename<PathTraits>(crfile_.cbegin(),
                                                   crfile_.cend())),
        crfile_ext_(std::find_if(crfile_.crbegin(),
                                 ReverseIterator(crfile_basename_),
                                 PathTraits::is_extension_separator).base()),
        crfile_basename_word_ends_(find_word_endings(crfile_basename_,
                                                     crfile_ext_)),
        match_crfile_(opts.match_crfile) {}